

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O1

void __thiscall
adios2::helper::CommImplDummy::Gather
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t recvcount,Datatype recvtype,int root,string *param_8)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  string local_50;
  
  if (sendbuf == (void *)0x0 && sendcount != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"sendbuf is null","");
    anon_unknown_8::CommDummyError(&local_50);
LAB_003f9718:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"recvbuf is null","");
    anon_unknown_8::CommDummyError(&local_50);
  }
  else {
    if (recvbuf == (void *)0x0 && recvcount != 0) goto LAB_003f9718;
    if (root == 0) {
      sVar1 = CommImpl::SizeOf(sendtype);
      sVar2 = CommImpl::SizeOf(recvtype);
      if (sVar2 * recvcount - sVar1 * sendcount == 0) {
        memcpy(recvbuf,sendbuf,sVar1 * sendcount);
        return;
      }
      goto LAB_003f976e;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"root is not 0","");
  anon_unknown_8::CommDummyError(&local_50);
LAB_003f976e:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"send and recv sizes differ","");
  anon_unknown_8::CommDummyError(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void CommImplDummy::Gather(const void *sendbuf, size_t sendcount, Datatype sendtype, void *recvbuf,
                           size_t recvcount, Datatype recvtype, int root, const std::string &) const
{
    if (sendcount > 0 && !sendbuf)
    {
        return CommDummyError("sendbuf is null");
    }
    if (recvcount > 0 && !recvbuf)
    {
        return CommDummyError("recvbuf is null");
    }
    if (root != 0)
    {
        return CommDummyError("root is not 0");
    }

    const size_t nsent = sendcount * CommImpl::SizeOf(sendtype);
    const size_t nrecv = recvcount * CommImpl::SizeOf(recvtype);

    if (nrecv != nsent)
    {
        return CommDummyError("send and recv sizes differ");
    }

    std::memcpy(recvbuf, sendbuf, nsent);
}